

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

triplet<unsigned_short> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
::decode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
           *this,triplet<unsigned_short> ra,triplet<unsigned_short> rb)

{
  array<charls::context_run_mode,_2UL> *context;
  int32_t iVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  uint predicted_value;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  triplet<unsigned_short> tVar7;
  default_traits<unsigned_short,_charls::triplet<unsigned_short>_> *this_00;
  uint predicted_value_00;
  
  predicted_value = rb._0_4_ >> 0x10;
  context = &this->context_run_mode_;
  iVar4 = decode_run_interruption_error(this,context->_M_elems);
  iVar5 = decode_run_interruption_error(this,context->_M_elems);
  iVar6 = decode_run_interruption_error(this,context->_M_elems);
  this_00 = &this->traits_;
  predicted_value_00 = rb._0_4_ & 0xffff;
  iVar1 = -iVar4;
  if ((ra._0_4_ & 0xffff) <= predicted_value_00) {
    iVar1 = iVar4;
  }
  tVar7.field_0.v1 =
       default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::
       compute_reconstructed_sample(this_00,predicted_value_00,iVar1);
  iVar1 = -iVar5;
  if (ra._0_4_ >> 0x10 <= predicted_value) {
    iVar1 = iVar5;
  }
  uVar2 = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::
          compute_reconstructed_sample(this_00,predicted_value,iVar1);
  iVar1 = -iVar6;
  if ((uint)ra.field_2.v3 <= (uint)rb.field_2.v3) {
    iVar1 = iVar6;
  }
  uVar3 = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::
          compute_reconstructed_sample(this_00,(uint)rb.field_2.v3,iVar1);
  tVar7.field_2.v3 = uVar3;
  tVar7.field_1.v2 = uVar2;
  return tVar7;
}

Assistant:

triplet<sample_type> decode_run_interruption_pixel(triplet<sample_type> ra, triplet<sample_type> rb)
    {
        const int32_t error_value1{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value2{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value3{decode_run_interruption_error(context_run_mode_[0])};

        return triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                    traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                    traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3)));
    }